

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hospital.cpp
# Opt level: O0

bool __thiscall Hospital::validate_String_Must_Be_character(Hospital *this,string *name)

{
  code *pcVar1;
  ulong uVar2;
  char *pcVar3;
  long lVar4;
  int local_28;
  int local_24;
  int i;
  int countr;
  string *name_local;
  Hospital *this_local;
  
  local_24 = 0;
  local_28 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::length();
    if (uVar2 <= (ulong)(long)local_28) {
      lVar4 = std::__cxx11::string::length();
      if (local_24 == lVar4) {
        return true;
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)name);
    if (((*pcVar3 < 'A') ||
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)name), 'Z' < *pcVar3)) &&
       ((pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)name), *pcVar3 < 'a' ||
        (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)name), 'z' < *pcVar3)))) break;
    local_24 = local_24 + 1;
    local_28 = local_28 + 1;
  }
  return false;
}

Assistant:

bool Hospital::validate_String_Must_Be_character(string name) {
    int countr = 0;
    for (int i = 0; i <name.length() ; ++i) {
        if((name[i]>=65 && name[i]<=90) || (name[i]>=97 && name[i]<=122) )countr ++;
        else {
            return false;
        }
    }
    if(countr == name.length())return true ;
}